

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall google::protobuf::Reflection::MaybePoisonAfterClear(Reflection *this,Message *root)

{
  bool bVar1;
  Arena *pAVar2;
  reference ppMVar3;
  reference pMVar4;
  byte local_102;
  MemBlock it;
  __normal_iterator<MemBlock_*,_std::vector<MemBlock,_std::allocator<MemBlock>_>_> local_e0;
  iterator __end2;
  iterator __begin2;
  vector<MemBlock,_std::allocator<MemBlock>_> *__range2;
  anon_class_24_3_758c1557 local_c0;
  Message *local_a8;
  Message *curr;
  undefined1 local_98 [8];
  queue<google::protobuf::Message_*,_std::deque<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>_>
  queue;
  undefined1 local_38 [8];
  vector<MemBlock,_std::allocator<MemBlock>_> nodes;
  bool heap_alloc;
  Message *root_local;
  Reflection *this_local;
  
  pAVar2 = MessageLite::GetArena(&root->super_MessageLite);
  nodes.super__Vector_base<MemBlock,_std::allocator<MemBlock>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = pAVar2 == (Arena *)0x0;
  std::vector<MemBlock,_std::allocator<MemBlock>_>::vector
            ((vector<MemBlock,_std::allocator<MemBlock>_> *)local_38);
  std::
  vector<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock,std::allocator<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock>>
  ::emplace_back<google::protobuf::Message&>
            ((vector<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock,std::allocator<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::MemBlock>>
              *)local_38,root);
  std::
  queue<google::protobuf::Message*,std::deque<google::protobuf::Message*,std::allocator<google::protobuf::Message*>>>
  ::queue<std::deque<google::protobuf::Message*,std::allocator<google::protobuf::Message*>>,void>
            ((queue<google::protobuf::Message*,std::deque<google::protobuf::Message*,std::allocator<google::protobuf::Message*>>>
              *)local_98);
  curr = root;
  std::
  queue<google::protobuf::Message_*,_std::deque<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>_>
  ::push((queue<google::protobuf::Message_*,_std::deque<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>_>
          *)local_98,&curr);
  while( true ) {
    bVar1 = std::
            queue<google::protobuf::Message_*,_std::deque<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>_>
            ::empty((queue<google::protobuf::Message_*,_std::deque<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>_>
                     *)local_98);
    local_102 = 0;
    if (!bVar1) {
      local_102 = nodes.super__Vector_base<MemBlock,_std::allocator<MemBlock>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._7_1_ ^ 0xff;
    }
    if ((local_102 & 1) == 0) break;
    ppMVar3 = std::
              queue<google::protobuf::Message_*,_std::deque<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>_>
              ::front((queue<google::protobuf::Message_*,_std::deque<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>_>
                       *)local_98);
    local_a8 = *ppMVar3;
    std::
    queue<google::protobuf::Message_*,_std::deque<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>_>
    ::pop((queue<google::protobuf::Message_*,_std::deque<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>_>
           *)local_98);
    local_c0.heap_alloc =
         (bool *)((long)&nodes.super__Vector_base<MemBlock,_std::allocator<MemBlock>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7);
    local_c0.nodes = (vector<MemBlock,_std::allocator<MemBlock>_> *)local_38;
    local_c0.queue =
         (queue<google::protobuf::Message_*,_std::deque<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>_>
          *)local_98;
    internal::
    VisitMutableMessageFields<google::protobuf::Reflection::MaybePoisonAfterClear(google::protobuf::Message&)const::__0>
              (local_a8,&local_c0);
  }
  (*(root->super_MessageLite)._vptr_MessageLite[2])();
  if ((nodes.super__Vector_base<MemBlock,_std::allocator<MemBlock>_>._M_impl.super__Vector_impl_data
       ._M_end_of_storage._7_1_ & 1) == 0) {
    __end2 = std::vector<MemBlock,_std::allocator<MemBlock>_>::begin
                       ((vector<MemBlock,_std::allocator<MemBlock>_> *)local_38);
    local_e0._M_current =
         (MemBlock *)
         std::vector<MemBlock,_std::allocator<MemBlock>_>::end
                   ((vector<MemBlock,_std::allocator<MemBlock>_> *)local_38);
    while (bVar1 = __gnu_cxx::operator!=(&__end2,&local_e0), bVar1) {
      pMVar4 = __gnu_cxx::
               __normal_iterator<MemBlock_*,_std::vector<MemBlock,_std::allocator<MemBlock>_>_>::
               operator*(&__end2);
      internal::PoisonMemoryRegion(pMVar4->ptr,*(ulong *)&pMVar4->size & 0xffffffff);
      __gnu_cxx::__normal_iterator<MemBlock_*,_std::vector<MemBlock,_std::allocator<MemBlock>_>_>::
      operator++(&__end2);
    }
  }
  std::
  queue<google::protobuf::Message_*,_std::deque<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>_>
  ::~queue((queue<google::protobuf::Message_*,_std::deque<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>_>
            *)local_98);
  std::vector<MemBlock,_std::allocator<MemBlock>_>::~vector
            ((vector<MemBlock,_std::allocator<MemBlock>_> *)local_38);
  return;
}

Assistant:

void Reflection::MaybePoisonAfterClear(Message& root) const {
  struct MemBlock {
    explicit MemBlock(Message& msg)
        : ptr(static_cast<void*>(&msg)), size(GetSize(msg)) {}

    static uint32_t GetSize(const Message& msg) {
      return msg.GetReflection()->schema_.GetObjectSize();
    }

    void* ptr;
    uint32_t size;
  };

  bool heap_alloc = root.GetArena() == nullptr;
  std::vector<MemBlock> nodes;

#ifdef __cpp_if_constexpr
  nodes.emplace_back(root);

  std::queue<Message*> queue;
  queue.push(&root);

  while (!queue.empty() && !heap_alloc) {
    Message* curr = queue.front();
    queue.pop();
    internal::VisitMutableMessageFields(*curr, [&](Message& msg) {
      if (msg.GetArena() == nullptr) {
        heap_alloc = true;
        return;
      }

      nodes.emplace_back(msg);
      // Also visits child messages.
      queue.push(&msg);
    });
  }
#endif

  root.Clear();

  // Heap allocated oneof messages will be freed on clear. So, poisoning
  // afterwards may cause use-after-free. Bailout.
  if (heap_alloc) return;

  for (auto it : nodes) {
    (void)it;
    internal::PoisonMemoryRegion(it.ptr, it.size);
  }
}